

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O1

void duckdb::
     HistogramFinalizeFunction<duckdb::HistogramStringFunctor,duckdb::string_t,duckdb::StringMapType<duckdb::OwningStringMap<unsigned_long,std::map<duckdb::string_t,unsigned_long,std::less<duckdb::string_t>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  ulong *puVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  idx_t size;
  Vector *this_00;
  Vector *pVVar7;
  ulong uVar8;
  _Rb_tree_node_base *p_Var9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  idx_t iVar11;
  ulong uVar12;
  data_ptr_t pdVar13;
  data_ptr_t pdVar14;
  idx_t iVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  string_t sVar19;
  UnifiedVectorFormat sdata;
  element_type *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  buffer_ptr<ValidityBuffer> *local_a0;
  Vector *local_98;
  ulong local_90;
  idx_t local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  local_88 = offset;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(state_vector,count,&local_78);
  FlatVector::VerifyFlatVector(result);
  size = ListVector::GetListSize(result);
  if (count == 0) {
    lVar17 = 0;
  }
  else {
    lVar17 = 0;
    iVar11 = 0;
    do {
      iVar15 = iVar11;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        iVar15 = (idx_t)(local_78.sel)->sel_vector[iVar11];
      }
      if (**(long **)(local_78.data + iVar15 * 8) != 0) {
        lVar17 = lVar17 + *(long *)(**(long **)(local_78.data + iVar15 * 8) + 0x30);
      }
      iVar11 = iVar11 + 1;
    } while (count != iVar11);
  }
  ListVector::Reserve(result,lVar17 + size);
  this_00 = MapVector::GetKeys(result);
  pVVar7 = MapVector::GetValues(result);
  if (count != 0) {
    pdVar2 = result->data;
    pdVar3 = pVVar7->data;
    local_a0 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
    uVar16 = 0;
    local_98 = result;
    local_90 = count;
    do {
      uVar8 = uVar16;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)(local_78.sel)->sel_vector[uVar16];
      }
      uVar12 = local_88 + uVar16;
      lVar17 = **(long **)(local_78.data + uVar8 * 8);
      if (lVar17 == 0) {
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_b8,&local_80);
          p_Var6 = p_Stack_b0;
          peVar5 = local_b8;
          local_b8 = (element_type *)0x0;
          p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar5;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var6;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
          }
          pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_a0);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar10->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar4 = (byte)uVar12 & 0x3f;
        puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                 (uVar12 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
      }
      else {
        pdVar13 = (data_ptr_t)(uVar12 * 0x10);
        *(idx_t *)(pdVar2 + (long)pdVar13) = size;
        p_Var9 = *(_Rb_tree_node_base **)(lVar17 + 0x20);
        if (p_Var9 != (_Rb_tree_node_base *)(lVar17 + 0x10)) {
          lVar18 = size * 8;
          pdVar14 = pdVar13;
          do {
            sVar19.value.pointer.ptr = (char *)pdVar14;
            sVar19.value._0_8_ = p_Var9[1]._M_parent;
            sVar19 = StringVector::AddStringOrBlob
                               ((StringVector *)this_00,*(Vector **)(p_Var9 + 1),sVar19);
            pdVar14 = this_00->data;
            *(long *)(pdVar14 + lVar18 * 2) = sVar19.value._0_8_;
            *(long *)(pdVar14 + lVar18 * 2 + 8) = sVar19.value._8_8_;
            *(_Base_ptr *)(pdVar3 + lVar18) = p_Var9[1]._M_left;
            size = size + 1;
            p_Var9 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var9);
            lVar18 = lVar18 + 8;
          } while (p_Var9 != (_Rb_tree_node_base *)(lVar17 + 0x10));
        }
        *(idx_t *)((long)(pdVar13 + (long)pdVar2) + 8) = size - *(long *)(pdVar13 + (long)pdVar2);
        count = local_90;
        result = local_98;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != count);
  }
  ListVector::SetListSize(result,size);
  Vector::Verify(result,count);
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void HistogramFinalizeFunction(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count,
                                      idx_t offset) {
	using HIST_STATE = HistogramAggState<T, typename MAP_TYPE::MAP_TYPE>;

	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	auto states = UnifiedVectorFormat::GetData<HIST_STATE *>(sdata);

	auto &mask = FlatVector::Validity(result);
	auto old_len = ListVector::GetListSize(result);
	idx_t new_entries = 0;
	// figure out how much space we need
	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			continue;
		}
		new_entries += state.hist->size();
	}
	// reserve space in the list vector
	ListVector::Reserve(result, old_len + new_entries);
	auto &keys = MapVector::GetKeys(result);
	auto &values = MapVector::GetValues(result);
	auto list_entries = FlatVector::GetData<list_entry_t>(result);
	auto count_entries = FlatVector::GetData<uint64_t>(values);

	idx_t current_offset = old_len;
	for (idx_t i = 0; i < count; i++) {
		const auto rid = i + offset;
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.hist) {
			mask.SetInvalid(rid);
			continue;
		}

		auto &list_entry = list_entries[rid];
		list_entry.offset = current_offset;
		for (auto &entry : *state.hist) {
			OP::template HistogramFinalize<T>(entry.first, keys, current_offset);
			count_entries[current_offset] = entry.second;
			current_offset++;
		}
		list_entry.length = current_offset - list_entry.offset;
	}
	D_ASSERT(current_offset == old_len + new_entries);
	ListVector::SetListSize(result, current_offset);
	result.Verify(count);
}